

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_unpk_rr(m68k_info *info)

{
  uint imm;
  
  if ((info->type & 0x1c) != 0) {
    imm = read_imm_16(info);
    build_rr(info,0x176,'\0',imm);
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_unpk_rr(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_rr(info, M68K_INS_UNPK, 0, read_imm_16(info));
}